

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeExtractSampleLists.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char *__rhs;
  int iVar1;
  runtime_error *this;
  allocator<char> local_931;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_930;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_910;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8f0;
  ifstream in;
  uint local_8c8;
  int aiStack_8b0 [122];
  SampleListParser resultHandler;
  TestLogParser parser;
  deUint8 buf [1024];
  
  if (argc == 2) {
    __rhs = argv[1];
    std::ifstream::ifstream(&in,__rhs,_S_in|_S_bin);
    SampleListParser::SampleListParser(&resultHandler);
    xe::TestLogParser::TestLogParser(&parser,&resultHandler.super_TestLogHandler);
    if (*(int *)((long)aiStack_8b0 + *(long *)(_in + -0x18)) != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_930,"Failed to open \'",&local_931);
      std::operator+(&local_910,&local_930,__rhs);
      std::operator+(&local_8f0,&local_910,"\'");
      std::runtime_error::runtime_error(this,(string *)&local_8f0);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    while( true ) {
      std::istream::read((char *)&in,(long)buf);
      if ((int)local_8c8 < 1) break;
      xe::TestLogParser::parse(&parser,buf,(ulong)(local_8c8 & 0x7fffffff));
    }
    std::ifstream::close();
    xe::TestLogParser::~TestLogParser(&parser);
    SampleListParser::~SampleListParser(&resultHandler);
    std::ifstream::~ifstream(&in);
    iVar1 = 0;
  }
  else {
    de::FilePath::FilePath((FilePath *)&in,*argv);
    de::FilePath::getBaseName_abi_cxx11_((string *)buf,(FilePath *)&in);
    printf("%s: [filename]\n",buf._0_8_);
    std::__cxx11::string::~string((string *)buf);
    std::__cxx11::string::~string((string *)&in);
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

int main (int argc, const char* const* argv)
{
	if (argc != 2)
	{
		printf("%s: [filename]\n", de::FilePath(argv[0]).getBaseName().c_str());
		return -1;
	}

	try
	{
		processLogFile(argv[1]);
	}
	catch (const std::exception& e)
	{
		printf("FATAL ERROR: %s\n", e.what());
		return -1;
	}

	return 0;
}